

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int adios2sys::SystemTools::GetTerminalWidth(void)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *__nptr;
  long lVar5;
  char *endptr;
  long t;
  string columns;
  winsize ws;
  int width;
  string *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string local_30 [36];
  short local_c;
  ushort local_a;
  uint local_4;
  
  local_4 = 0xffffffff;
  std::__cxx11::string::string(local_30);
  iVar3 = ioctl(1,0x5413,&local_c);
  if (((iVar3 != -1) && (local_a != 0)) && (local_c != 0)) {
    local_4 = (uint)local_a;
  }
  iVar3 = isatty(1);
  if (iVar3 == 0) {
    local_4 = 0xffffffff;
  }
  bVar2 = GetEnv(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if ((bVar2) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    __nptr = (char *)std::__cxx11::string::c_str();
    lVar5 = strtol(__nptr,(char **)&stack0xffffffffffffffb0,0);
    if (((in_stack_ffffffffffffffb0 != (string *)0x0) &&
        ((in_stack_ffffffffffffffb0->_M_dataplus == (_Alloc_hider)0x0 && (0 < lVar5)))) &&
       (lVar5 < 1000)) {
      local_4 = (uint)lVar5;
    }
  }
  if ((int)local_4 < 9) {
    local_4 = 0xffffffff;
  }
  uVar1 = local_4;
  std::__cxx11::string::~string(local_30);
  return uVar1;
}

Assistant:

int SystemTools::GetTerminalWidth()
{
  int width = -1;
#ifdef HAVE_TTY_INFO
  struct winsize ws;
  std::string columns; /* Unix98 environment variable */
  if (ioctl(1, TIOCGWINSZ, &ws) != -1 && ws.ws_col > 0 && ws.ws_row > 0) {
    width = ws.ws_col;
  }
  if (!isatty(STDOUT_FILENO)) {
    width = -1;
  }
  if (SystemTools::GetEnv("COLUMNS", columns) && !columns.empty()) {
    long t;
    char* endptr;
    t = strtol(columns.c_str(), &endptr, 0);
    if (endptr && !*endptr && (t > 0) && (t < 1000)) {
      width = static_cast<int>(t);
    }
  }
  if (width < 9) {
    width = -1;
  }
#endif
  return width;
}